

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

PgHdr1 * pcache1AllocPage(PCache1 *pCache,int benignMalloc)

{
  int iVar1;
  void *pvVar2;
  void *pPg;
  PgHdr1 *p;
  int benignMalloc_local;
  PCache1 *pCache_local;
  
  if ((pCache->pFree == (PgHdr1 *)0x0) &&
     ((pCache->nPage != 0 || (iVar1 = pcache1InitBulk(pCache), iVar1 == 0)))) {
    if (benignMalloc != 0) {
      sqlite3BeginBenignMalloc();
    }
    pvVar2 = pcache1Alloc(pCache->szAlloc);
    pPg = (void *)((long)pvVar2 + (long)pCache->szPage);
    if (benignMalloc != 0) {
      sqlite3EndBenignMalloc();
    }
    if (pvVar2 == (void *)0x0) {
      return (PgHdr1 *)0x0;
    }
    *(void **)pPg = pvVar2;
    *(undefined8 **)((long)pPg + 8) = (undefined8 *)((long)pPg + 0x38);
    *(undefined1 *)((long)pPg + 0x15) = 0;
    *(undefined1 *)((long)pPg + 0x16) = 0;
  }
  else {
    pPg = pCache->pFree;
    pCache->pFree = ((PgHdr1 *)pPg)->pNext;
    ((PgHdr1 *)pPg)->pNext = (PgHdr1 *)0x0;
  }
  if (pCache->bPurgeable != 0) {
    pCache->pGroup->nCurrentPage = pCache->pGroup->nCurrentPage + 1;
  }
  return (PgHdr1 *)pPg;
}

Assistant:

static PgHdr1 *pcache1AllocPage(PCache1 *pCache, int benignMalloc){
  PgHdr1 *p = 0;
  void *pPg;

  assert( sqlite3_mutex_held(pCache->pGroup->mutex) );
  if( pCache->pFree || (pCache->nPage==0 && pcache1InitBulk(pCache)) ){
    p = pCache->pFree;
    pCache->pFree = p->pNext;
    p->pNext = 0;
  }else{
#ifdef SQLITE_ENABLE_MEMORY_MANAGEMENT
    /* The group mutex must be released before pcache1Alloc() is called. This
    ** is because it might call sqlite3_release_memory(), which assumes that 
    ** this mutex is not held. */
    assert( pcache1.separateCache==0 );
    assert( pCache->pGroup==&pcache1.grp );
    pcache1LeaveMutex(pCache->pGroup);
#endif
    if( benignMalloc ){ sqlite3BeginBenignMalloc(); }
#ifdef SQLITE_PCACHE_SEPARATE_HEADER
    pPg = pcache1Alloc(pCache->szPage);
    p = sqlite3Malloc(sizeof(PgHdr1) + pCache->szExtra);
    if( !pPg || !p ){
      pcache1Free(pPg);
      sqlite3_free(p);
      pPg = 0;
    }
#else
    pPg = pcache1Alloc(pCache->szAlloc);
    p = (PgHdr1 *)&((u8 *)pPg)[pCache->szPage];
#endif
    if( benignMalloc ){ sqlite3EndBenignMalloc(); }
#ifdef SQLITE_ENABLE_MEMORY_MANAGEMENT
    pcache1EnterMutex(pCache->pGroup);
#endif
    if( pPg==0 ) return 0;
    p->page.pBuf = pPg;
    p->page.pExtra = &p[1];
    p->isBulkLocal = 0;
    p->isAnchor = 0;
  }
  if( pCache->bPurgeable ){
    pCache->pGroup->nCurrentPage++;
  }
  return p;
}